

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void purge_invisible_characters(tgestate_t *state)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  char cVar4;
  vischar_t *vischar;
  uint uVar5;
  
  bVar1 = (state->map_position).x;
  uVar5 = (uint)(byte)(bVar1 - 9);
  if (bVar1 < 9) {
    uVar5 = 0;
  }
  bVar1 = (state->map_position).y;
  uVar3 = (uint)(byte)(bVar1 - 9);
  if (bVar1 < 9) {
    uVar3 = 0;
  }
  vischar = state->vischars;
  cVar4 = -7;
  do {
    vischar = vischar + 1;
    if ((vischar->character != 0xff) &&
       ((((state->room_index != vischar->room ||
          (uVar2 = (vischar->isopos).y + 4 >> 3 & 0xff, uVar2 <= uVar3)) ||
         ((int)(state->rows + uVar3 + 0x11) < (int)uVar2)) ||
        ((uVar2 = (uint)vischar->isopos >> 3 & 0xff, uVar2 <= uVar5 ||
         (((int)(uVar5 + 9 + state->columns) < 0xf6 &&
          ((int)(state->columns + uVar5 + 9 + 9) < (int)uVar2)))))))) {
      reset_visible_character(state,vischar);
    }
    cVar4 = cVar4 + '\x01';
  } while (cVar4 != '\0');
  return;
}

Assistant:

void purge_invisible_characters(tgestate_t *state)
{
  /* Size, in UDGs, of a buffer zone around the visible screen in which
   * visible characters will persist. (Compare to the spawning size of
   * 8). */
  enum { GRACE = 9 };

  uint8_t    miny, minx;  /* was D, E */
  uint8_t    iters;       /* was B */
  vischar_t *vischar;     /* was HL */
  uint8_t    y;           /* was C */
  uint8_t    x;           /* was C */

  assert(state != NULL);

  /* Calculate clamped lower bound. */
  minx = MAX(state->map_position.x - GRACE, 0);
  miny = MAX(state->map_position.y - GRACE, 0);

  iters   = vischars_LENGTH - 1;
  vischar = &state->vischars[1]; /* iterate over non-player characters */
  do
  {
    /* Ignore inactive characters. */
    if (vischar->character == character_NONE)
      goto next;

    /* Reset this character if it's not in the current room. */
    if (state->room_index != vischar->room)
      goto reset;

    // FUTURE
    //
    // /* Calculate clamped upper bound. */
    // maxx = MIN(minx + EDGE + state->columns + EDGE, 255);
    // maxy = MIN(miny + EDGE + (state->rows - 1) + EDGE, 255);
    //
    // t = (vischar->isopos.y + 4) / 8 / 256; // round
    // if (t <= miny || t > maxy)
    //   goto reset;
    // t = (vischar->isopos.x) / 8 / 256;
    // if (t <= minx || t > maxx)
    //   goto reset;

    /* Conv: Replaced screen dimension constants with state->columns/rows. */

    /* Handle Y part */
    y = divround(vischar->isopos.y);
    /* The original code uses 16 instead of 17 for 'rows' so match that. */
    if (y <= miny || y > MIN(miny + GRACE + (state->rows - 1) + GRACE, 255))
      goto reset;

    /* Handle X part */
    x = vischar->isopos.x / 8; /* round down */
    if (x <= minx || x > MIN(minx + GRACE + state->columns + GRACE, 255))
      goto reset;

    goto next;

reset:
    reset_visible_character(state, vischar);

next:
    vischar++;
  }
  while (--iters);
}